

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

XmlStringRef * __thiscall
QXmlStreamReaderPrivate::namespaceForPrefix
          (XmlStringRef *__return_storage_ptr__,QXmlStreamReaderPrivate *this,QStringView prefix)

{
  long lVar1;
  NamespaceDeclaration *pNVar2;
  qsizetype qVar3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  storage_type_conflict *psVar7;
  storage_type_conflict *psVar8;
  XmlStringRef *lhs;
  long lVar9;
  long in_FS_OFFSET;
  QStringView rhs;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView prefix_local;
  
  psVar7 = prefix.m_data;
  lhs = (XmlStringRef *)prefix.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  psVar8 = psVar7;
  lVar4 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos * 0x30;
  prefix_local.m_size = (qsizetype)lhs;
  prefix_local.m_data = psVar7;
  do {
    lVar9 = lVar4;
    if (lVar9 == -0x30) {
      if (lhs != (XmlStringRef *)0x0 && (this->field_0x3a9 & 0x10) != 0) {
        QXmlStream::tr((QString *)&QStack_78,"Namespace prefix \'%1\' not declared",(char *)0x0,-1);
        QString::arg<QStringView,_true>
                  ((QString *)&local_60,(QString *)&QStack_78,&prefix_local,0,(QChar)0x20);
        raiseWellFormedError(this,(QString *)&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
      }
      __return_storage_ptr__->m_size = 0;
      __return_storage_ptr__->m_string = (QString *)0x0;
      __return_storage_ptr__->m_pos = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_003557de;
    }
    rhs.m_data = psVar8;
    rhs.m_size = (qsizetype)psVar7;
    bVar5 = QtPrivate::operator==((QtPrivate *)((long)&(pNVar2->prefix).m_string + lVar9),lhs,rhs);
    lVar4 = lVar9 + -0x30;
  } while (!bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    puVar6 = (undefined8 *)((long)&(pNVar2->namespaceUri).m_string + lVar9);
    __return_storage_ptr__->m_size = puVar6[2];
    qVar3 = puVar6[1];
    __return_storage_ptr__->m_string = (QString *)*puVar6;
    __return_storage_ptr__->m_pos = qVar3;
    return __return_storage_ptr__;
  }
LAB_003557de:
  __stack_chk_fail();
}

Assistant:

XmlStringRef QXmlStreamReaderPrivate::namespaceForPrefix(QStringView prefix)
{
     for (const NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
         if (namespaceDeclaration.prefix == prefix) {
             return namespaceDeclaration.namespaceUri;
         }
     }

#if 1
     if (namespaceProcessing && !prefix.isEmpty())
         raiseWellFormedError(QXmlStream::tr("Namespace prefix '%1' not declared").arg(prefix));
#endif

     return XmlStringRef();
}